

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

LispPTR * MakeAtom68k(char *string)

{
  LispPTR LVar1;
  size_t sVar2;
  
  sVar2 = strlen(string);
  LVar1 = make_atom(string,0,(DLword)sVar2);
  if (LVar1 == 0xffffffff) {
    error("MakeAtom68k: no such atom found");
  }
  return (LispPTR *)(Lisp_world + (LVar1 * 10 + 0x2c0002));
}

Assistant:

LispPTR *MakeAtom68k(char *string) {
  LispPTR index;
  index = make_atom(string, 0, strlen(string));
  if (index == 0xffffffff) {
      error("MakeAtom68k: no such atom found");
  }
#ifdef BIGVM
  index = (ATOMS_HI << 16) + (index * 10) + NEWATOM_VALUE_OFFSET;
#else
  index = VALS_OFFSET + (index << 1);
#endif /* BIGVM */
  return ((LispPTR *) NativeAligned4FromLAddr(index));
}